

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage3Runner.hpp
# Opt level: O0

void * __thiscall Centaurus::Stage3Runner::acquire_bank(Stage3Runner *this)

{
  void *pvVar1;
  WindowBankState WVar2;
  int local_24;
  int i;
  WindowBankEntry *banks;
  Stage3Runner *this_local;
  
  pvVar1 = (this->super_BaseRunner).m_sub_window;
  do {
    for (local_24 = 0; local_24 < (this->super_BaseRunner).m_bank_num; local_24 = local_24 + 1) {
      WVar2 = std::atomic::operator_cast_to_WindowBankState
                        ((atomic *)((long)pvVar1 + (long)local_24 * 8 + 4));
      if (WVar2 == Stage2_Unlocked) {
        if (*(int *)((long)pvVar1 + (long)local_24 * 8) == this->m_counter) {
          std::atomic<Centaurus::BaseRunner::WindowBankState>::operator=
                    ((atomic<Centaurus::BaseRunner::WindowBankState> *)
                     ((long)pvVar1 + (long)local_24 * 8 + 4),Stage3_Locked);
          if (this->m_xferlistener != (TransferListener)0x0) {
            (*this->m_xferlistener)
                      (local_24,*(int *)((long)pvVar1 + (long)local_24 * 8),this->m_listener_context
                      );
          }
          this->m_current_bank = local_24;
          this->m_counter = this->m_counter + 1;
          return (void *)((long)(this->super_BaseRunner).m_main_window +
                         (this->super_BaseRunner).m_bank_size * (long)local_24);
        }
      }
      else {
        WVar2 = std::atomic::operator_cast_to_WindowBankState
                          ((atomic *)((long)pvVar1 + (long)local_24 * 8 + 4));
        if (WVar2 == YouAreDone) {
          return (void *)0x0;
        }
      }
    }
  } while( true );
}

Assistant:

void *acquire_bank()
  {
    WindowBankEntry *banks = reinterpret_cast<WindowBankEntry *>(m_sub_window);
    while (true) {
      for (int i = 0; i < m_bank_num; i++) {
        if (banks[i].state == WindowBankState::Stage2_Unlocked) {
          if (banks[i].number == m_counter) {
            banks[i].state = WindowBankState::Stage3_Locked;

            if (m_xferlistener != nullptr)
              m_xferlistener(i, banks[i].number, m_listener_context);

            //std::cout << "Bank " << banks[i].number << " reached Stage3" << std::endl;

            m_current_bank = i;
            m_counter++;
            return (char *)m_main_window + m_bank_size * i;
          }
        } else if (banks[i].state == WindowBankState::YouAreDone) {
          return NULL;
        }
      }
    }
  }